

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_string_vector_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  flatbuffers_uoffset_t local_3c;
  void *pvStack_38;
  flatbuffers_uoffset_t count;
  flatbuffers_uoffset_t *p;
  size_t len_local;
  char *name_local;
  int id_local;
  flatcc_json_printer_table_descriptor_t *td_local;
  flatcc_json_printer_t *ctx_local;
  
  pvVar3 = get_field_ptr(td,id);
  if (pvVar3 != (void *)0x0) {
    iVar1 = td->count;
    td->count = iVar1 + 1;
    if (iVar1 != 0) {
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = ',';
    }
    pvStack_38 = read_uoffset_ptr(pvVar3);
    local_3c = __flatbuffers_uoffset_read_from_pe(pvStack_38);
    pvStack_38 = (void *)((long)pvStack_38 + 4);
    print_name(ctx,name,len);
    ctx->level = ctx->level + 1;
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = '[';
    if (local_3c != 0) {
      if (ctx->indent == '\0') {
        flatcc_json_printer_flush_partial(ctx);
      }
      else {
        pcVar2 = ctx->p;
        ctx->p = pcVar2 + 1;
        *pcVar2 = '\n';
        print_indent(ctx);
      }
      pvVar3 = read_uoffset_ptr(pvStack_38);
      print_string_object(ctx,pvVar3);
      local_3c = local_3c - 1;
    }
    while (local_3c != 0) {
      pvStack_38 = (void *)((long)pvStack_38 + 4);
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = ',';
      if (ctx->indent == '\0') {
        flatcc_json_printer_flush_partial(ctx);
      }
      else {
        pcVar2 = ctx->p;
        ctx->p = pcVar2 + 1;
        *pcVar2 = '\n';
        print_indent(ctx);
      }
      pvVar3 = read_uoffset_ptr(pvStack_38);
      print_string_object(ctx,pvVar3);
      local_3c = local_3c - 1;
    }
    if (ctx->indent != '\0') {
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = '\n';
      ctx->level = ctx->level + -1;
      print_indent(ctx);
    }
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = ']';
  }
  return;
}

Assistant:

void flatcc_json_printer_string_vector_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len)
{
    const uoffset_t *p = get_field_ptr(td, id);
    uoffset_t count;

    if (p) {
        if (td->count++) {
            print_char(',');
        }
        p = read_uoffset_ptr(p);
        count = __flatbuffers_uoffset_read_from_pe(p);
        ++p;
        print_name(ctx, name, len);
        print_start('[');
        if (count) {
            print_nl();
            print_string_object(ctx, read_uoffset_ptr(p));
            --count;
        }
        while (count--) {
            ++p;
            print_char(',');
            print_nl();
            print_string_object(ctx, read_uoffset_ptr(p));
        }
        print_end(']');
    }
}